

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  byte bVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar31 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar69 [64];
  undefined1 auVar42 [32];
  
  pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  auVar31 = *(undefined1 (*) [16])(pcVar4 + uVar2 * sVar5);
  lVar19 = (uVar2 + 1) * sVar5;
  auVar30 = *(undefined1 (*) [16])(pcVar4 + lVar19);
  lVar20 = (uVar2 + 2) * sVar5;
  auVar28 = *(undefined1 (*) [16])(pcVar4 + lVar20);
  lVar21 = (uVar2 + 3) * sVar5;
  auVar26 = *(undefined1 (*) [16])(pcVar4 + lVar21);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar8 = fVar1 * *(float *)(pcVar4 + uVar2 * sVar5 + 0xc);
  fVar9 = fVar1 * *(float *)(pcVar4 + lVar19 + 0xc);
  fVar10 = fVar1 * *(float *)(pcVar4 + lVar20 + 0xc);
  auVar22 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(*(uint *)(pcVar4 + lVar21 + 0xc)));
  uVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar17 = (ulong)uVar2;
  uVar63 = auVar28._0_4_;
  uVar54 = auVar31._0_4_;
  uVar68 = auVar30._0_4_;
  if (uVar17 == 4) {
    auVar52._4_4_ = fVar10;
    auVar52._0_4_ = fVar10;
    auVar52._8_4_ = fVar10;
    auVar52._12_4_ = fVar10;
    auVar53 = vblendps_avx(auVar28,auVar52,8);
    auVar57._4_4_ = uVar54;
    auVar57._0_4_ = uVar54;
    auVar57._8_4_ = uVar54;
    auVar57._12_4_ = uVar54;
    auVar29 = vshufps_avx(auVar31,auVar31,0x55);
    auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar55._4_4_ = fVar8;
    auVar55._0_4_ = fVar8;
    auVar55._8_4_ = fVar8;
    auVar55._12_4_ = fVar8;
    auVar62._4_4_ = uVar68;
    auVar62._0_4_ = uVar68;
    auVar62._8_4_ = uVar68;
    auVar62._12_4_ = uVar68;
    auVar27 = vshufps_avx(auVar30,auVar30,0x55);
    auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
    auVar59._4_4_ = fVar9;
    auVar59._0_4_ = fVar9;
    auVar59._8_4_ = fVar9;
    auVar59._12_4_ = fVar9;
    auVar66._4_4_ = uVar63;
    auVar66._0_4_ = uVar63;
    auVar66._8_4_ = uVar63;
    auVar66._12_4_ = uVar63;
    auVar23 = vshufps_avx512vl(auVar28,auVar28,0x55);
    auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar24 = vbroadcastss_avx512vl(auVar26);
    auVar25 = vshufps_avx512vl(auVar26,auVar26,0x55);
    auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
    auVar22 = vbroadcastss_avx512vl(auVar22);
    auVar24 = vmulps_avx512vl(auVar24,catmullrom_basis0._3740_16_);
    auVar25 = vmulps_avx512vl(auVar25,catmullrom_basis0._3740_16_);
    auVar26 = vmulps_avx512vl(auVar26,catmullrom_basis0._3740_16_);
    auVar22 = vmulps_avx512vl(auVar22,catmullrom_basis0._3740_16_);
    auVar24 = vfmadd231ps_avx512vl(auVar24,catmullrom_basis0._2584_16_,auVar66);
    auVar23 = vfmadd231ps_avx512vl(auVar25,catmullrom_basis0._2584_16_,auVar23);
    auVar28 = vfmadd231ps_fma(auVar26,catmullrom_basis0._2584_16_,auVar28);
    auVar26 = vfmadd231ps_avx512vl(auVar22,auVar52,catmullrom_basis0._2584_16_);
    auVar22 = vfmadd231ps_avx512vl(auVar24,catmullrom_basis0._1428_16_,auVar62);
    auVar27 = vfmadd231ps_avx512vl(auVar23,catmullrom_basis0._1428_16_,auVar27);
    auVar30 = vfmadd231ps_fma(auVar28,catmullrom_basis0._1428_16_,auVar30);
    auVar28 = vfmadd231ps_avx512vl(auVar26,catmullrom_basis0._1428_16_,auVar59);
    auVar23 = vfmadd231ps_avx512vl(auVar22,catmullrom_basis0._272_16_,auVar57);
    auVar29 = vfmadd231ps_avx512vl(auVar27,catmullrom_basis0._272_16_,auVar29);
    auVar22 = vfmadd231ps_fma(auVar30,catmullrom_basis0._272_16_,auVar31);
    auVar27 = vfmadd231ps_avx512vl(auVar28,catmullrom_basis0._272_16_,auVar55);
    auVar24 = vshufps_avx512vl(auVar23,auVar23,0xb1);
    auVar30 = vminps_avx512vl(auVar24,auVar23);
    auVar31 = vshufpd_avx(auVar30,auVar30,1);
    auVar31 = vminps_avx(auVar31,auVar30);
    auVar25 = vshufps_avx512vl(auVar29,auVar29,0xb1);
    auVar28 = vminps_avx512vl(auVar25,auVar29);
    auVar30 = vshufpd_avx(auVar28,auVar28,1);
    auVar30 = vminps_avx(auVar30,auVar28);
    auVar31 = vinsertps_avx(auVar31,auVar30,0x1c);
    auVar26 = vshufps_avx(auVar22,auVar22,0xb1);
    auVar30 = vminps_avx(auVar26,auVar22);
    auVar28 = vshufpd_avx(auVar30,auVar30,1);
    auVar30 = vminps_avx(auVar28,auVar30);
    auVar31 = vinsertps_avx(auVar31,auVar30,0x20);
    auVar28 = vmaxps_avx512vl(auVar24,auVar23);
    auVar30 = vshufpd_avx(auVar28,auVar28,1);
    auVar30 = vmaxps_avx(auVar30,auVar28);
    auVar29 = vmaxps_avx512vl(auVar25,auVar29);
    auVar28 = vshufpd_avx(auVar29,auVar29,1);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar30 = vinsertps_avx(auVar30,auVar28,0x1c);
    auVar28 = vmaxps_avx(auVar26,auVar22);
    auVar26 = vshufpd_avx(auVar28,auVar28,1);
    auVar28 = vmaxps_avx(auVar26,auVar28);
    auVar30 = vinsertps_avx(auVar30,auVar28,0x20);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl(auVar27,auVar26);
    auVar26 = vprolq_avx512vl(auVar28,0x20);
    auVar28 = vmaxps_avx(auVar26,auVar28);
    uVar54 = auVar28._0_4_;
    auVar29._4_4_ = uVar54;
    auVar29._0_4_ = uVar54;
    auVar29._8_4_ = uVar54;
    auVar29._12_4_ = uVar54;
    auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar31 = vminps_avx(auVar31,auVar53);
    auVar30 = vmaxps_avx(auVar30,auVar53);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(auVar52,auVar22);
    auVar28 = vmaxps_avx(auVar28,auVar26);
    auVar31 = vsubps_avx(auVar31,auVar28);
  }
  else {
    if ((int)uVar2 < 0) {
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar31 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar45 = ZEXT1632(auVar31);
      auVar47 = auVar46;
      auVar33 = auVar46;
      auVar43 = auVar48;
      auVar44 = auVar48;
    }
    else {
      auVar32 = vpbroadcastd_avx512vl();
      auVar67._8_4_ = 1;
      auVar67._0_8_ = 0x100000001;
      auVar67._12_4_ = 1;
      auVar67._16_4_ = 1;
      auVar67._20_4_ = 1;
      auVar67._24_4_ = 1;
      auVar67._28_4_ = 1;
      auVar51 = vpermps_avx2(auVar67,ZEXT1632(auVar31));
      auVar33 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar34 = vpermps_avx512vl(auVar33,ZEXT1632(auVar31));
      auVar56._4_4_ = fVar8;
      auVar56._0_4_ = fVar8;
      auVar56._8_4_ = fVar8;
      auVar56._12_4_ = fVar8;
      auVar56._16_4_ = fVar8;
      auVar56._20_4_ = fVar8;
      auVar56._24_4_ = fVar8;
      auVar56._28_4_ = fVar8;
      auVar58._4_4_ = uVar68;
      auVar58._0_4_ = uVar68;
      auVar58._8_4_ = uVar68;
      auVar58._12_4_ = uVar68;
      auVar58._16_4_ = uVar68;
      auVar58._20_4_ = uVar68;
      auVar58._24_4_ = uVar68;
      auVar58._28_4_ = uVar68;
      auVar12 = vpermps_avx2(auVar67,ZEXT1632(auVar30));
      auVar35 = vpermps_avx512vl(auVar33,ZEXT1632(auVar30));
      auVar60._4_4_ = fVar9;
      auVar60._0_4_ = fVar9;
      auVar60._8_4_ = fVar9;
      auVar60._12_4_ = fVar9;
      auVar60._16_4_ = fVar9;
      auVar60._20_4_ = fVar9;
      auVar60._24_4_ = fVar9;
      auVar60._28_4_ = fVar9;
      auVar61._4_4_ = uVar63;
      auVar61._0_4_ = uVar63;
      auVar61._8_4_ = uVar63;
      auVar61._12_4_ = uVar63;
      auVar61._16_4_ = uVar63;
      auVar61._20_4_ = uVar63;
      auVar61._24_4_ = uVar63;
      auVar61._28_4_ = uVar63;
      auVar13 = vpermps_avx2(auVar67,ZEXT1632(auVar28));
      auVar36 = vpermps_avx512vl(auVar33,ZEXT1632(auVar28));
      auVar64._4_4_ = fVar10;
      auVar64._0_4_ = fVar10;
      auVar64._8_4_ = fVar10;
      auVar64._12_4_ = fVar10;
      auVar64._16_4_ = fVar10;
      auVar64._20_4_ = fVar10;
      auVar64._24_4_ = fVar10;
      auVar64._28_4_ = fVar10;
      uVar68 = auVar26._0_4_;
      auVar65._4_4_ = uVar68;
      auVar65._0_4_ = uVar68;
      auVar65._8_4_ = uVar68;
      auVar65._12_4_ = uVar68;
      auVar65._16_4_ = uVar68;
      auVar65._20_4_ = uVar68;
      auVar65._24_4_ = uVar68;
      auVar65._28_4_ = uVar68;
      auVar67 = vpermps_avx2(auVar67,ZEXT1632(auVar26));
      auVar37 = vpermps_avx512vl(auVar33,ZEXT1632(auVar26));
      auVar38 = vbroadcastss_avx512vl(auVar22);
      lVar19 = uVar17 * 0x44;
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar31 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar69 = ZEXT1664(auVar31);
      uVar18 = 0;
      auVar50 = auVar40;
      auVar16 = auVar39;
      auVar41 = auVar39;
      auVar42 = auVar40;
      do {
        auVar33 = vpbroadcastd_avx512vl();
        auVar43 = vpord_avx512vl(auVar33,_DAT_01fe9900);
        auVar33 = *(undefined1 (*) [32])(catmullrom_basis0 + uVar18 * 4 + lVar19);
        auVar48 = *(undefined1 (*) [32])(lVar19 + 0x21b37f0 + uVar18 * 4);
        auVar47 = *(undefined1 (*) [32])(lVar19 + 0x21b3c74 + uVar18 * 4);
        uVar14 = vpcmpgtd_avx512vl(auVar43,auVar32);
        auVar43 = *(undefined1 (*) [32])(lVar19 + 0x21b40f8 + uVar18 * 4);
        auVar44 = vmulps_avx512vl(auVar65,auVar43);
        auVar45 = vmulps_avx512vl(auVar67,auVar43);
        auVar46 = vmulps_avx512vl(auVar37,auVar43);
        auVar43 = vmulps_avx512vl(auVar38,auVar43);
        auVar44 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar61);
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar47,auVar13);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar47,auVar36);
        auVar47 = vfmadd231ps_avx512vl(auVar43,auVar64,auVar47);
        auVar43 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar58);
        auVar44 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar12);
        auVar45 = vfmadd231ps_avx512vl(auVar46,auVar48,auVar35);
        auVar48 = vfmadd231ps_avx512vl(auVar47,auVar60,auVar48);
        auVar49._4_4_ = uVar54;
        auVar49._0_4_ = uVar54;
        auVar49._8_4_ = uVar54;
        auVar49._12_4_ = uVar54;
        auVar49._16_4_ = uVar54;
        auVar49._20_4_ = uVar54;
        auVar49._24_4_ = uVar54;
        auVar49._28_4_ = uVar54;
        auVar47 = vfmadd231ps_avx512vl(auVar43,auVar33,auVar49);
        auVar46 = vfmadd231ps_avx512vl(auVar44,auVar33,auVar51);
        auVar45 = vfmadd231ps_avx512vl(auVar45,auVar33,auVar34);
        auVar49 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar33);
        auVar15._8_4_ = 0x7fffffff;
        auVar15._0_8_ = 0x7fffffff7fffffff;
        auVar15._12_4_ = 0x7fffffff;
        auVar15._16_4_ = 0x7fffffff;
        auVar15._20_4_ = 0x7fffffff;
        auVar15._24_4_ = 0x7fffffff;
        auVar15._28_4_ = 0x7fffffff;
        vandps_avx512vl(auVar49,auVar15);
        auVar33 = vminps_avx512vl(auVar42,auVar47);
        bVar6 = (byte)uVar14;
        auVar43._0_4_ = (uint)(bVar6 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar33._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar33._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar33._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar7 * auVar42._16_4_ | (uint)!bVar7 * auVar33._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar7 * auVar42._20_4_ | (uint)!bVar7 * auVar33._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar7 * auVar42._24_4_ | (uint)!bVar7 * auVar33._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar43._28_4_ = (uint)bVar7 * auVar42._28_4_ | (uint)!bVar7 * auVar33._28_4_;
        auVar33 = vminps_avx512vl(auVar50,auVar46);
        auVar48._0_4_ = (uint)(bVar6 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar33._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar33._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar33._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar7 * auVar50._16_4_ | (uint)!bVar7 * auVar33._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar7 * auVar50._20_4_ | (uint)!bVar7 * auVar33._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar7 * auVar50._24_4_ | (uint)!bVar7 * auVar33._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar48._28_4_ = (uint)bVar7 * auVar50._28_4_ | (uint)!bVar7 * auVar33._28_4_;
        auVar33 = vminps_avx512vl(auVar40,auVar45);
        auVar44._0_4_ = (uint)(bVar6 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar33._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * auVar33._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar7 * auVar40._12_4_ | (uint)!bVar7 * auVar33._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * auVar33._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar7 * auVar40._20_4_ | (uint)!bVar7 * auVar33._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar7 * auVar40._24_4_ | (uint)!bVar7 * auVar33._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar44._28_4_ = (uint)bVar7 * auVar40._28_4_ | (uint)!bVar7 * auVar33._28_4_;
        auVar33 = vmaxps_avx512vl(auVar41,auVar47);
        auVar47._0_4_ = (uint)(bVar6 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar33._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar7 * auVar41._4_4_ | (uint)!bVar7 * auVar33._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar7 * auVar41._8_4_ | (uint)!bVar7 * auVar33._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * auVar33._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar7 * auVar41._16_4_ | (uint)!bVar7 * auVar33._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar7 * auVar41._20_4_ | (uint)!bVar7 * auVar33._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar7 * auVar41._24_4_ | (uint)!bVar7 * auVar33._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar47._28_4_ = (uint)bVar7 * auVar41._28_4_ | (uint)!bVar7 * auVar33._28_4_;
        auVar46 = vmaxps_avx512vl(auVar16,auVar46);
        auVar33._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar46._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar7 * auVar16._4_4_ | (uint)!bVar7 * auVar46._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar7 * auVar16._8_4_ | (uint)!bVar7 * auVar46._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar7 * auVar16._12_4_ | (uint)!bVar7 * auVar46._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar7 * auVar16._16_4_ | (uint)!bVar7 * auVar46._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar7 * auVar16._20_4_ | (uint)!bVar7 * auVar46._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar7 * auVar16._24_4_ | (uint)!bVar7 * auVar46._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar33._28_4_ = (uint)bVar7 * auVar16._28_4_ | (uint)!bVar7 * auVar46._28_4_;
        auVar45 = vmaxps_avx512vl(auVar39,auVar45);
        auVar46._0_4_ = (uint)(bVar6 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar45._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar7 * auVar39._4_4_ | (uint)!bVar7 * auVar45._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar7 * auVar39._8_4_ | (uint)!bVar7 * auVar45._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar7 * auVar39._12_4_ | (uint)!bVar7 * auVar45._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar7 * auVar39._16_4_ | (uint)!bVar7 * auVar45._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar7 * auVar39._20_4_ | (uint)!bVar7 * auVar45._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar7 * auVar39._24_4_ | (uint)!bVar7 * auVar45._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar46._28_4_ = (uint)bVar7 * auVar39._28_4_ | (uint)!bVar7 * auVar45._28_4_;
        auVar50 = vmaxps_avx512vl(auVar69._0_32_,auVar49);
        auVar45._0_4_ = (uint)(bVar6 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar50._0_4_
        ;
        bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar7 * auVar69._4_4_ | (uint)!bVar7 * auVar50._4_4_;
        bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar7 * auVar69._8_4_ | (uint)!bVar7 * auVar50._8_4_;
        bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar7 * auVar69._12_4_ | (uint)!bVar7 * auVar50._12_4_;
        bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar7 * auVar69._16_4_ | (uint)!bVar7 * auVar50._16_4_;
        bVar7 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar7 * auVar69._20_4_ | (uint)!bVar7 * auVar50._20_4_;
        bVar7 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar7 * auVar69._24_4_ | (uint)!bVar7 * auVar50._24_4_;
        bVar7 = SUB81(uVar14 >> 7,0);
        auVar45._28_4_ = (uint)bVar7 * auVar69._28_4_ | (uint)!bVar7 * auVar50._28_4_;
        uVar18 = uVar18 + 8;
        auVar69 = ZEXT3264(auVar45);
        auVar40 = auVar44;
        auVar39 = auVar46;
        auVar50 = auVar48;
        auVar16 = auVar33;
        auVar41 = auVar47;
        auVar42 = auVar43;
      } while (uVar18 <= uVar17);
    }
    auVar51 = vshufps_avx512vl(auVar43,auVar43,0xb1);
    auVar51 = vminps_avx512vl(auVar43,auVar51);
    auVar43 = vshufpd_avx(auVar51,auVar51,5);
    auVar43 = vminps_avx(auVar51,auVar43);
    auVar31 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
    auVar43 = vshufps_avx512vl(auVar48,auVar48,0xb1);
    auVar43 = vminps_avx512vl(auVar48,auVar43);
    auVar48 = vshufpd_avx(auVar43,auVar43,5);
    auVar48 = vminps_avx(auVar43,auVar48);
    auVar30 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
    auVar30 = vunpcklps_avx(auVar31,auVar30);
    auVar48 = vshufps_avx512vl(auVar44,auVar44,0xb1);
    auVar43 = vminps_avx512vl(auVar44,auVar48);
    auVar48 = vshufpd_avx(auVar43,auVar43,5);
    auVar48 = vminps_avx(auVar43,auVar48);
    auVar31 = vminps_avx(auVar48._0_16_,auVar48._16_16_);
    auVar31 = vinsertps_avx(auVar30,auVar31,0x28);
    auVar48 = vshufps_avx512vl(auVar47,auVar47,0xb1);
    auVar47 = vmaxps_avx512vl(auVar47,auVar48);
    auVar48 = vshufpd_avx(auVar47,auVar47,5);
    auVar48 = vmaxps_avx(auVar47,auVar48);
    auVar30 = vmaxps_avx(auVar48._0_16_,auVar48._16_16_);
    auVar48 = vshufps_avx512vl(auVar33,auVar33,0xb1);
    auVar48 = vmaxps_avx512vl(auVar33,auVar48);
    auVar33 = vshufpd_avx(auVar48,auVar48,5);
    auVar33 = vmaxps_avx(auVar48,auVar33);
    auVar28 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar28 = vunpcklps_avx(auVar30,auVar28);
    auVar33 = vshufps_avx512vl(auVar46,auVar46,0xb1);
    auVar48 = vmaxps_avx512vl(auVar46,auVar33);
    auVar33 = vshufpd_avx(auVar48,auVar48,5);
    auVar33 = vmaxps_avx(auVar48,auVar33);
    auVar30 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar30 = vinsertps_avx(auVar28,auVar30,0x28);
    auVar33 = vshufps_avx512vl(auVar45,auVar45,0xb1);
    auVar48 = vmaxps_avx512vl(auVar45,auVar33);
    auVar33 = vshufpd_avx(auVar48,auVar48,5);
    auVar33 = vmaxps_avx(auVar48,auVar33);
    auVar28 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
    auVar31 = vsubps_avx(auVar31,auVar28);
  }
  auVar53._0_4_ = auVar30._0_4_ + auVar28._0_4_;
  auVar53._4_4_ = auVar30._4_4_ + auVar28._4_4_;
  auVar53._8_4_ = auVar30._8_4_ + auVar28._8_4_;
  auVar53._12_4_ = auVar30._12_4_ + auVar28._12_4_;
  auVar27._8_4_ = 0x7fffffff;
  auVar27._0_8_ = 0x7fffffff7fffffff;
  auVar27._12_4_ = 0x7fffffff;
  auVar30 = vandps_avx(auVar31,auVar27);
  auVar28 = vandps_avx(auVar53,auVar27);
  auVar30 = vmaxps_avx(auVar30,auVar28);
  auVar28 = vmovshdup_avx(auVar30);
  auVar28 = vmaxss_avx(auVar28,auVar30);
  auVar30 = vshufpd_avx(auVar30,auVar30,1);
  auVar30 = vmaxss_avx(auVar30,auVar28);
  fVar1 = auVar30._0_4_ * 4.7683716e-07;
  auVar30._4_4_ = fVar1;
  auVar30._0_4_ = fVar1;
  auVar30._8_4_ = fVar1;
  auVar30._12_4_ = fVar1;
  aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar31,auVar30);
  (__return_storage_ptr__->lower).field_0 = aVar11;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar53._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar53._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar53._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar53._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }